

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O0

void mpr_add_n1_node_to_set(avl_tree *set,nhdp_neighbor *neigh,nhdp_link *lnk,uint32_t offset)

{
  undefined8 *puVar1;
  long local_48;
  n1_node *tmp_n1_neigh;
  uint32_t offset_local;
  nhdp_link *lnk_local;
  nhdp_neighbor *neigh_local;
  avl_tree *set_local;
  
  local_48 = avl_find(set,neigh);
  if (local_48 == 0) {
    local_48 = 0;
  }
  else {
    local_48 = local_48 + -0x28;
  }
  if (local_48 == 0) {
    puVar1 = (undefined8 *)calloc(1,0x68);
    *puVar1 = *(undefined8 *)(neigh->originator)._addr;
    puVar1[1] = *(undefined8 *)((neigh->originator)._addr + 8);
    *(undefined2 *)(puVar1 + 2) = *(undefined2 *)&(neigh->originator)._type;
    puVar1[10] = puVar1;
    puVar1[4] = neigh;
    puVar1[3] = lnk;
    *(uint32_t *)(puVar1 + 0xc) = offset;
    avl_insert(set,puVar1 + 5);
  }
  return;
}

Assistant:

void
mpr_add_n1_node_to_set(struct avl_tree *set, struct nhdp_neighbor *neigh, struct nhdp_link *lnk, uint32_t offset) {
  struct n1_node *tmp_n1_neigh;
  tmp_n1_neigh = avl_find_element(set, &neigh->originator, tmp_n1_neigh, _avl_node);
  if (tmp_n1_neigh) {
    return;
  }
  tmp_n1_neigh = calloc(1, sizeof(struct n1_node));
  tmp_n1_neigh->addr = neigh->originator;
  tmp_n1_neigh->_avl_node.key = &tmp_n1_neigh->addr;
  tmp_n1_neigh->neigh = neigh;
  tmp_n1_neigh->link = lnk;
  tmp_n1_neigh->table_offset = offset;
  avl_insert(set, &tmp_n1_neigh->_avl_node);
}